

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  long lVar1;
  grasshopper_round_keys_t *pgVar2;
  grasshopper_w128_t *buffer;
  uint8_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  grasshopper_w128_t *source;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uchar newkey [32];
  grasshopper_w128_t local_58;
  grasshopper_w128_t local_48;
  
  lVar11 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar10 = EVP_CIPHER_CTX_get_num(ctx);
  uVar13 = inl;
  if (inl != 0 && (uVar10 & 0xf) != 0) {
    lVar12 = 0;
    do {
      out[lVar12] = *(byte *)((ulong)(uVar10 & 0xf) + lVar11 + 0x198 + lVar12) ^ in[lVar12];
      lVar1 = lVar12 + 1;
      if ((uVar10 + (int)lVar12 + 1 & 0xf) == 0) break;
      bVar15 = inl - 1 != lVar12;
      lVar12 = lVar1;
    } while (bVar15);
    out = out + lVar1;
    in = in + lVar1;
    uVar10 = uVar10 + (int)lVar1;
    uVar13 = inl - lVar1;
  }
  if (0xf < uVar13) {
    pgVar2 = (grasshopper_round_keys_t *)(lVar11 + 0x48);
    buffer = (grasshopper_w128_t *)(lVar11 + 0x188);
    uVar14 = 0;
    do {
      if (*(int *)(lVar11 + 0x1a8) - 1U < uVar10) {
        grasshopper_encrypt_block(pgVar2,(grasshopper_w128_t *)ACPKM_D_2018,&local_58,buffer);
        grasshopper_encrypt_block
                  (pgVar2,(grasshopper_w128_t *)(ACPKM_D_2018 + 0x10),&local_48,buffer);
        *(uint64_t *)(lVar11 + 0x28) = local_58.q[0];
        *(uint64_t *)(lVar11 + 0x30) = local_58.q[1];
        *(uint64_t *)(lVar11 + 0x38) = local_48.q[0];
        *(uint64_t *)(lVar11 + 0x40) = local_48.q[1];
        grasshopper_set_encrypt_key(pgVar2,(grasshopper_key_t *)(lVar11 + 0x28));
        grasshopper_set_decrypt_key
                  ((grasshopper_round_keys_t *)(lVar11 + 0xe8),(grasshopper_key_t *)(lVar11 + 0x28))
        ;
        uVar10 = uVar10 & 0xf;
      }
      grasshopper_encrypt_block(pgVar2,source,(grasshopper_w128_t *)(lVar11 + 0x198),buffer);
      uVar4 = *(uint *)(lVar11 + 0x19c);
      uVar5 = *(uint *)(lVar11 + 0x1a0);
      uVar6 = *(uint *)(lVar11 + 0x1a4);
      uVar7 = *(uint *)((long)in + 4);
      uVar8 = *(uint *)((long)in + 8);
      uVar9 = *(uint *)((long)in + 0xc);
      *(uint *)out = *(uint *)in ^ ((grasshopper_w128_t *)(lVar11 + 0x198))->d[0];
      *(uint *)((long)out + 4) = uVar7 ^ uVar4;
      *(uint *)((long)out + 8) = uVar8 ^ uVar5;
      *(uint *)((long)out + 0xc) = uVar9 ^ uVar6;
      lVar12 = 0xf;
      do {
        uVar3 = source->b[lVar12];
        source->b[lVar12] = uVar3 + '\x01';
        bVar15 = lVar12 == 0;
        lVar12 = lVar12 + -1;
        if (bVar15) break;
      } while ((uint8_t)(uVar3 + '\x01') == '\0');
      in = (uchar *)((long)in + 0x10);
      out = (uchar *)((long)out + 0x10);
      uVar10 = uVar10 + 0x10;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13 >> 4);
    uVar13 = (ulong)((uint)uVar13 & 0xf);
  }
  if (uVar13 != 0) {
    if (*(int *)(lVar11 + 0x1a8) - 1U < uVar10) {
      pgVar2 = (grasshopper_round_keys_t *)(lVar11 + 0x48);
      grasshopper_encrypt_block
                (pgVar2,(grasshopper_w128_t *)ACPKM_D_2018,&local_58,
                 (grasshopper_w128_t *)(lVar11 + 0x188));
      grasshopper_encrypt_block
                (pgVar2,(grasshopper_w128_t *)(ACPKM_D_2018 + 0x10),&local_48,
                 (grasshopper_w128_t *)(lVar11 + 0x188));
      *(uint64_t *)(lVar11 + 0x28) = local_58.q[0];
      *(uint64_t *)(lVar11 + 0x30) = local_58.q[1];
      *(uint64_t *)(lVar11 + 0x38) = local_48.q[0];
      *(uint64_t *)(lVar11 + 0x40) = local_48.q[1];
      grasshopper_set_encrypt_key(pgVar2,(grasshopper_key_t *)(lVar11 + 0x28));
      grasshopper_set_decrypt_key
                ((grasshopper_round_keys_t *)(lVar11 + 0xe8),(grasshopper_key_t *)(lVar11 + 0x28));
      uVar10 = uVar10 & 0xf;
    }
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar11 + 0x48),source,
               (grasshopper_w128_t *)(lVar11 + 0x198),(grasshopper_w128_t *)(lVar11 + 0x188));
    uVar14 = 0;
    do {
      *(byte *)((long)out + uVar14) =
           *(byte *)((long)in + uVar14) ^ ((grasshopper_w128_t *)(lVar11 + 0x198))->b[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    lVar11 = 0xf;
    do {
      uVar3 = source->b[lVar11];
      source->b[lVar11] = uVar3 + '\x01';
      bVar15 = lVar11 == 0;
      lVar11 = lVar11 + -1;
      if (bVar15) break;
    } while ((uint8_t)(uVar3 + '\x01') == '\0');
    uVar10 = uVar10 + (int)uVar13;
  }
  EVP_CIPHER_CTX_set_num(ctx,uVar10);
  return (int)inl;
}

Assistant:

static int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,
                                               unsigned char *out,
                                               const unsigned char *in,
                                               size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
    grasshopper_w128_t tmp;

    while ((num & GRASSHOPPER_BLOCK_MASK) && lasted) {
        *out++ = *in++ ^ c->partial_buffer.b[num & GRASSHOPPER_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    // full parts
    for (i = 0; i < blocks; i++) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) & c->partial_buffer,
                                  &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer,
                            (grasshopper_w128_t *) in);
        grasshopper_copy128((grasshopper_w128_t *) out, &tmp);
        ctr128_inc(iv);
        in += GRASSHOPPER_BLOCK_SIZE;
        out += GRASSHOPPER_BLOCK_SIZE;
        num += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    // last part
    if (lasted > 0) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++)
            out[i] = c->partial_buffer.b[i] ^ in[i];
        ctr128_inc(iv);
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}